

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall
embree::XMLWriter::XMLWriter
          (XMLWriter *this,Ref<embree::SceneGraph::Node> *root,FileName *fileName,bool embedTextures
          ,bool referenceMaterials,bool binaryFormat)

{
  undefined1 *puVar1;
  fstream *this_00;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  pointer pcVar6;
  int __oflag;
  FileName binFileName;
  Ref<embree::SceneGraph::Node> local_b8;
  FileName local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::fstream::fstream(this);
  this_00 = &this->bin;
  std::fstream::fstream(this_00);
  p_Var2 = &(this->nodeMap)._M_t._M_impl.super__Rb_tree_header;
  (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->ident = 0;
  this->currentNodeID = 0;
  (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->nodeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->textureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->embedTextures = embedTextures;
  this->referenceMaterials = referenceMaterials;
  this->binaryFormat = binaryFormat;
  lVar5 = *(long *)(*(long *)this + -0x18);
  *(undefined4 *)(&this->field_0x1c + lVar5) = 5;
  std::ios::clear((int)this + (int)lVar5);
  paVar3 = &local_b0.filename.field_2;
  pcVar6 = (fileName->filename)._M_dataplus._M_p;
  local_b0.filename._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar6,pcVar6 + (fileName->filename)._M_string_length);
  std::fstream::open((string *)this,(_Ios_Openmode)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.filename._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0.filename._M_dataplus._M_p);
  }
  if (binaryFormat) {
    paVar4 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,".bin","");
    FileName::addExt(&local_b0,fileName,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar4) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    lVar5 = *(long *)(*(long *)this_00 + -0x18);
    *(undefined4 *)(&this->field_0x22c + lVar5) = 5;
    std::ios::clear((int)this_00 + (int)lVar5);
    local_90._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_b0.filename._M_dataplus._M_p,
               local_b0.filename._M_dataplus._M_p + local_b0.filename._M_string_length);
    std::fstream::open((string *)this_00,(_Ios_Openmode)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar4) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.filename._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0.filename._M_dataplus._M_p);
    }
  }
  puVar1 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"<?xml version=\"1.0\"?>",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)puVar1 + -0x18) + (char)puVar1);
  std::ostream::put((char)puVar1);
  std::ostream::flush();
  (*(root->ptr->super_RefCount)._vptr_RefCount[6])();
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"scene","");
  open(this,(char *)local_50,__oflag);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_b8 = (Ref<embree::SceneGraph::Node>)root->ptr;
  if (local_b8.ptr != (Node *)0x0) {
    (*((local_b8.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  store(this,&local_b8);
  if (local_b8.ptr != (Node *)0x0) {
    (*((local_b8.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"scene","");
  close(this,(int)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  (*(root->ptr->super_RefCount)._vptr_RefCount[8])();
  return;
}

Assistant:

XMLWriter::XMLWriter(Ref<SceneGraph::Node> root, const FileName& fileName, bool embedTextures, bool referenceMaterials, bool binaryFormat) 
    : ident(0), currentNodeID(0), embedTextures(embedTextures), referenceMaterials(referenceMaterials), binaryFormat(binaryFormat)
  {
    xml.exceptions (std::fstream::failbit | std::fstream::badbit);
    xml.open (fileName, std::fstream::out);

    if (binaryFormat)
    {
      const FileName binFileName = fileName.addExt(".bin");
      bin.exceptions (std::fstream::failbit | std::fstream::badbit);
      bin.open (binFileName, std::fstream::out | std::fstream::binary);
    }

    xml << "<?xml version=\"1.0\"?>" << std::endl;
    root->calculateInDegree();
    open("scene");
    store(root);
    close("scene");
    root->resetInDegree();
  }